

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O3

void __thiscall blockfilter_tests::blockfilters_json_test::test_method(blockfilters_json_test *this)

{
  CScript scriptPubKeyIn;
  undefined8 uVar1;
  int iVar2;
  ssize_t sVar3;
  UniValue *this_00;
  UniValue *pUVar4;
  long lVar5;
  UniValue *pUVar6;
  string *psVar7;
  UniValue *this_01;
  optional<uint256> *poVar8;
  size_t in_RCX;
  undefined1 **line_num;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  size_t index;
  iterator in_R8;
  iterator pvVar12;
  iterator in_R9;
  iterator pvVar13;
  size_t index_00;
  long in_FS_OFFSET;
  readonly_property<bool> rVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  string_view hex_str;
  string_view hex_str_00;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  string_view str;
  string_view str_00;
  string_view str_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> filter_basic;
  CBlockUndo block_undo;
  uint256 computed_header_basic;
  BlockFilter computed_filter_basic;
  uint256 filter_header_basic;
  uint256 prev_filter_header_basic;
  string strTest;
  UniValue json;
  undefined4 uVar17;
  undefined4 uVar18;
  check_type cVar19;
  char *in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  char *local_398;
  char *local_390;
  assertion_result local_388;
  char **local_370;
  assertion_result local_368;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_300;
  undefined1 local_2e8 [16];
  pointer local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  lazy_ostream local_210;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined1 local_1f0 [16];
  shared_count sStack_1e0;
  char *local_1d8;
  uint local_1cc;
  pointer local_1a0;
  pointer local_198;
  pointer local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_168;
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_160;
  uchar auStack_150 [8];
  direct_or_indirect local_148;
  uint local_12c;
  undefined1 local_128 [24];
  char *pcStack_110;
  readonly_property<bool> local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [11];
  undefined5 local_cd;
  undefined1 auStack_c8 [11];
  undefined1 local_b0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  pointer local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = &local_78;
  local_80 = (pointer)0x0;
  local_78._M_local_buf[0] = '\0';
  local_b0._32_4_ = 0;
  local_68 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  sVar3 = ::UniValue::read((UniValue *)(local_b0 + 0x20),0x4598,
                           json_tests::detail_blockfilters_bytes,in_RCX);
  if (((byte)sVar3 & local_b0._32_4_ == 2) == 0) {
    local_220 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_218 = "";
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x86;
    file_04.m_begin = (iterator)&local_220;
    msg_04.m_end = in_R9;
    msg_04.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_230,
               msg_04);
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    stack0xfffffffffffffe18 = (undefined1  [16])0x0;
    local_128[8] = 0;
    local_128._0_8_ = &PTR__lazy_ostream_013aeed0;
    pcStack_110 = "Parse error.";
    local_128._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_240 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_238 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1f0,(lazy_ostream *)local_128,1,1,WARN,_cVar19,
               (size_t)&local_240,0x86);
    boost::detail::shared_count::~shared_count(&sStack_1e0);
  }
  else {
    this_00 = ::UniValue::get_array((UniValue *)(local_b0 + 0x20));
    if ((this_00->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this_00->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start) {
      index_00 = 0;
      do {
        pUVar4 = ::UniValue::operator[](this_00,index_00);
        ::UniValue::write_abi_cxx11_((UniValue *)local_b0,(int)pUVar4,(void *)0x0,0);
        lVar5 = (long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (lVar5 != 0x58) {
          if ((ulong)((lVar5 >> 3) * 0x2e8ba2e8ba2e8ba3) < 7) {
            local_250 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
            ;
            local_248 = "";
            local_260 = &boost::unit_test::basic_cstring<char_const>::null;
            local_258 = &boost::unit_test::basic_cstring<char_const>::null;
            file.m_end = (iterator)0x92;
            file.m_begin = (iterator)&local_250;
            msg.m_end = in_R9;
            msg.m_begin = in_R8;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
                       (size_t)&local_260,msg);
            local_168._M_current = local_168._M_current & 0xffffffffffffff00;
            sStack_160.px = (element_type *)0x0;
            sStack_160.pn.pi_ = (sp_counted_base *)0x0;
            local_1f0._8_8_ = local_1f0._9_8_ << 8;
            local_1f0._0_8_ = &PTR__lazy_ostream_013adbd8;
            sStack_1e0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_1d8 = "Bad test: ";
            local_128[8] = 0;
            local_128._0_8_ = &PTR__lazy_ostream_013adc18;
            pcStack_110 = local_b0;
            local_128._16_8_ = local_1f0;
            local_270 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
            ;
            local_268 = "";
            in_R8 = (iterator)0x1;
            in_R9 = (iterator)0x1;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&local_168,(lazy_ostream *)local_128,1,1,WARN,
                       (check_type)this_00,(size_t)&local_270,0x92);
            boost::detail::shared_count::~shared_count(&sStack_160.pn);
          }
          else {
            pUVar6 = ::UniValue::operator[](pUVar4,0);
            ::UniValue::getInt<int>(pUVar6);
            local_280 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
            ;
            local_278 = "";
            local_290 = &boost::unit_test::basic_cstring<char_const>::null;
            local_288 = &boost::unit_test::basic_cstring<char_const>::null;
            line_num = &local_290;
            file_00.m_end = (iterator)0x98;
            file_00.m_begin = (iterator)&local_280;
            msg_00.m_end = in_R9;
            msg_00.m_begin = in_R8;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                       (size_t)line_num,msg_00);
            pUVar6 = ::UniValue::operator[](pUVar4,1);
            psVar7 = ::UniValue::get_str_abi_cxx11_(pUVar6);
            str._M_str = (char *)line_num;
            str._M_len = (size_t)(psVar7->_M_dataplus)._M_p;
            detail::FromHex<uint256>
                      ((optional<uint256> *)local_128,(detail *)psVar7->_M_string_length,str);
            local_168._M_current._0_1_ = local_108.super_class_property<bool>.value;
            sStack_160.px = (element_type *)0x0;
            sStack_160.pn.pi_ = (sp_counted_base *)0x0;
            local_188 = "uint256::FromHex(test[pos++].get_str())";
            uStack_180 = "";
            local_1f0._8_8_ = local_1f0._9_8_ << 8;
            local_1f0._0_8_ = &PTR__lazy_ostream_013ae1c8;
            sStack_1e0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_1d8 = (char *)&local_188;
            local_2a0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
            ;
            local_298 = "";
            pvVar12 = (iterator)0x1;
            pvVar13 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&local_168,(lazy_ostream *)local_1f0,1,0,WARN,
                       (check_type)this_00,(size_t)&local_2a0,0x98);
            boost::detail::shared_count::~shared_count(&sStack_160.pn);
            auStack_c8 = SUB1611((undefined1  [16])0x0,5);
            local_d8 = SUB1611((undefined1  [16])0x0,0);
            local_cd = 0;
            local_e8 = (undefined1  [16])0x0;
            local_f8 = (undefined1  [16])0x0;
            _local_108 = (undefined1  [16])0x0;
            stack0xfffffffffffffee8 = (undefined1  [16])0x0;
            local_128._0_8_ = (_func_int **)0x0;
            local_128[8] = false;
            local_128._9_7_ = 0;
            local_2b0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
            ;
            local_2a8 = "";
            local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_01.m_end = (iterator)0x9b;
            file_01.m_begin = (iterator)&local_2b0;
            msg_01.m_end = pvVar13;
            msg_01.m_begin = pvVar12;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                       (size_t)&local_2c0,msg_01);
            pUVar6 = ::UniValue::operator[](pUVar4,2);
            psVar7 = ::UniValue::get_str_abi_cxx11_(pUVar6);
            local_168._M_current._0_1_ =
                 (class_property<bool>)DecodeHexBlk((CBlock *)local_128,psVar7);
            sStack_160.px = (element_type *)0x0;
            sStack_160.pn.pi_ = (sp_counted_base *)0x0;
            local_188 = "DecodeHexBlk(block, test[pos++].get_str())";
            uStack_180 = "";
            local_1f0._8_8_ = local_1f0._9_8_ << 8;
            local_1f0._0_8_ = &PTR__lazy_ostream_013ae1c8;
            sStack_1e0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_1d8 = (char *)&local_188;
            local_2d0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
            ;
            local_2c8 = "";
            uVar17 = 0;
            uVar18 = 0;
            pvVar12 = (iterator)0x0;
            pcVar9 = (char *)0x9b;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&local_168,(lazy_ostream *)local_1f0,2,0,WARN,
                       (check_type)this_00,(size_t)&local_2d0,0x9b);
            boost::detail::shared_count::~shared_count(&sStack_160.pn);
            local_2e8 = (undefined1  [16])0x0;
            local_2d8 = (pointer)0x0;
            std::vector<CTxUndo,_std::allocator<CTxUndo>_>::_M_realloc_insert<>
                      ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)local_2e8,(iterator)0x0);
            uVar1 = local_2e8._8_8_;
            pUVar6 = ::UniValue::operator[](pUVar4,3);
            pUVar6 = ::UniValue::get_array(pUVar6);
            if ((pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar11 = 1;
              index = 0;
              do {
                this_01 = ::UniValue::operator[](pUVar6,index);
                psVar7 = ::UniValue::get_str_abi_cxx11_(this_01);
                hex_str._M_str = (psVar7->_M_dataplus)._M_p;
                hex_str._M_len = psVar7->_M_string_length;
                ParseHex<unsigned_char>
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168,
                           hex_str);
                local_188 = (char *)0x0;
                prevector<28U,_unsigned_char,_unsigned_int,_int>::
                prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           &local_148.indirect_contents,local_168,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )sStack_160.px);
                scriptPubKeyIn.super_CScriptBase._union._4_4_ = uVar18;
                scriptPubKeyIn.super_CScriptBase._union._0_4_ = uVar17;
                scriptPubKeyIn.super_CScriptBase._union._8_8_ = this_00;
                scriptPubKeyIn.super_CScriptBase._union._16_8_ = in_stack_fffffffffffffc58;
                scriptPubKeyIn.super_CScriptBase._24_8_ = in_stack_fffffffffffffc60;
                CTxOut::CTxOut((CTxOut *)local_1f0,&local_188,scriptPubKeyIn);
                if (0x1c < local_12c) {
                  free(local_148.indirect_contents.indirect);
                  local_148.indirect_contents.indirect = (char *)0x0;
                }
                local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
                local_210._vptr_lazy_ostream =
                     (_func_int **)((ulong)local_210._vptr_lazy_ostream & 0xffffffffffffff00);
                std::vector<Coin,std::allocator<Coin>>::emplace_back<CTxOut&,int,bool>
                          ((vector<Coin,std::allocator<Coin>> *)(uVar1 + -0x18),(CTxOut *)local_1f0,
                           (int *)&local_188,(bool *)&local_210);
                if (0x1c < local_1cc) {
                  free((void *)local_1f0._8_8_);
                }
                if (local_168._M_current != (uchar *)0x0) {
                  operator_delete(local_168._M_current,
                                  (long)sStack_160.pn.pi_ - (long)local_168._M_current);
                }
                index = (size_t)uVar11;
                pcVar9 = &DAT_2e8ba2e8ba2e8ba3;
                uVar10 = ((long)(pUVar6->values).
                                super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)(pUVar6->values).
                                super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
                uVar11 = uVar11 + 1;
              } while (index <= uVar10 && uVar10 - index != 0);
            }
            pUVar6 = ::UniValue::operator[](pUVar4,4);
            psVar7 = ::UniValue::get_str_abi_cxx11_(pUVar6);
            str_00._M_str = pcVar9;
            str_00._M_len = (size_t)(psVar7->_M_dataplus)._M_p;
            detail::FromHex<uint256>
                      ((optional<uint256> *)local_1f0,(detail *)psVar7->_M_string_length,str_00);
            pcVar9 = "test_method";
            poVar8 = inline_assertion_check<true,std::optional<uint256>>
                               ((optional<uint256> *)local_1f0,
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
                                ,0xa7,"test_method","uint256::FromHex(test[pos++].get_str())");
            local_168._M_current =
                 *(uchar **)
                  &(poVar8->super__Optional_base<uint256,_true,_true>)._M_payload.
                   super__Optional_payload_base<uint256>._M_payload;
            sStack_160 = *(shared_ptr<boost::basic_wrap_stringstream<char>_> *)
                          ((long)&(poVar8->super__Optional_base<uint256,_true,_true>)._M_payload.
                                  super__Optional_payload_base<uint256>._M_payload + 8);
            auStack_150 = *(uchar (*) [8])
                           ((long)&(poVar8->super__Optional_base<uint256,_true,_true>)._M_payload.
                                   super__Optional_payload_base<uint256>._M_payload + 0x18);
            pUVar6 = ::UniValue::operator[](pUVar4,5);
            psVar7 = ::UniValue::get_str_abi_cxx11_(pUVar6);
            hex_str_00._M_str = (psVar7->_M_dataplus)._M_p;
            hex_str_00._M_len = psVar7->_M_string_length;
            ParseHex<unsigned_char>(&local_300,hex_str_00);
            pUVar4 = ::UniValue::operator[](pUVar4,6);
            psVar7 = ::UniValue::get_str_abi_cxx11_(pUVar4);
            str_01._M_str = pcVar9;
            str_01._M_len = (size_t)(psVar7->_M_dataplus)._M_p;
            detail::FromHex<uint256>
                      ((optional<uint256> *)local_1f0,(detail *)psVar7->_M_string_length,str_01);
            pcVar9 = "uint256::FromHex(test[pos++].get_str())";
            poVar8 = inline_assertion_check<true,std::optional<uint256>>
                               ((optional<uint256> *)local_1f0,
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
                                ,0xa9,"test_method","uint256::FromHex(test[pos++].get_str())");
            local_188 = *(char **)&(poVar8->super__Optional_base<uint256,_true,_true>)._M_payload.
                                   super__Optional_payload_base<uint256>._M_payload;
            uStack_180 = *(char **)((long)&(poVar8->super__Optional_base<uint256,_true,_true>).
                                           _M_payload.super__Optional_payload_base<uint256>.
                                           _M_payload + 8);
            local_178 = *(undefined8 *)
                         ((long)&(poVar8->super__Optional_base<uint256,_true,_true>)._M_payload.
                                 super__Optional_payload_base<uint256>._M_payload + 0x10);
            uStack_170 = *(undefined8 *)
                          ((long)&(poVar8->super__Optional_base<uint256,_true,_true>)._M_payload.
                                  super__Optional_payload_base<uint256>._M_payload + 0x18);
            BlockFilter::BlockFilter
                      ((BlockFilter *)local_1f0,BASIC,(CBlock *)local_128,(CBlockUndo *)local_2e8);
            local_310 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
            ;
            local_308 = "";
            local_320 = &boost::unit_test::basic_cstring<char_const>::null;
            local_318 = &boost::unit_test::basic_cstring<char_const>::null;
            file_02.m_end = (iterator)0xac;
            file_02.m_begin = (iterator)&local_310;
            msg_02.m_end = pvVar12;
            msg_02.m_begin = pcVar9;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                       (size_t)&local_320,msg_02);
            if ((long)local_198 - (long)local_1a0 ==
                (long)local_300.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_300.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
              if (local_198 == local_1a0) {
                rVar14.super_class_property<bool>.value = (class_property<bool>)true;
              }
              else {
                iVar2 = bcmp(local_1a0,
                             local_300.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (long)local_198 - (long)local_1a0);
                rVar14.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
              }
            }
            else {
              rVar14.super_class_property<bool>.value = (class_property<bool>)false;
            }
            local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)
                    (readonly_property<bool>)rVar14.super_class_property<bool>.value;
            local_388.m_message.px = (element_type *)0x0;
            local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_368._0_8_ = "computed_filter_basic.GetFilter().GetEncoded() == filter_basic";
            local_368.m_message.px = (element_type *)0xe6b17f;
            local_210.m_empty = false;
            local_210._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
            local_200 = boost::unit_test::lazy_ostream::inst;
            uStack_1f8 = (char **)&local_368;
            local_330 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
            ;
            local_328 = "";
            pvVar12 = (iterator)0x1;
            pvVar13 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (&local_388,&local_210,1,0,WARN,(check_type)this_00,(size_t)&local_330,0xac);
            boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
            BlockFilter::ComputeHeader
                      ((uint256 *)&local_210,(BlockFilter *)local_1f0,(uint256 *)&local_168);
            local_340 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
            ;
            local_338 = "";
            local_350 = &boost::unit_test::basic_cstring<char_const>::null;
            local_348 = &boost::unit_test::basic_cstring<char_const>::null;
            file_03.m_end = (iterator)0xaf;
            file_03.m_begin = (iterator)&local_340;
            msg_03.m_end = pvVar13;
            msg_03.m_begin = pvVar12;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                       (size_t)&local_350,msg_03);
            auVar16[0] = -((char)local_200 == (char)local_178);
            auVar16[1] = -(local_200._1_1_ == local_178._1_1_);
            auVar16[2] = -(local_200._2_1_ == local_178._2_1_);
            auVar16[3] = -(local_200._3_1_ == local_178._3_1_);
            auVar16[4] = -(local_200._4_1_ == local_178._4_1_);
            auVar16[5] = -(local_200._5_1_ == local_178._5_1_);
            auVar16[6] = -(local_200._6_1_ == local_178._6_1_);
            auVar16[7] = -(local_200._7_1_ == local_178._7_1_);
            auVar16[8] = -((char)uStack_1f8 == (char)uStack_170);
            auVar16[9] = -(uStack_1f8._1_1_ == uStack_170._1_1_);
            auVar16[10] = -(uStack_1f8._2_1_ == uStack_170._2_1_);
            auVar16[0xb] = -(uStack_1f8._3_1_ == uStack_170._3_1_);
            auVar16[0xc] = -(uStack_1f8._4_1_ == uStack_170._4_1_);
            auVar16[0xd] = -(uStack_1f8._5_1_ == uStack_170._5_1_);
            auVar16[0xe] = -(uStack_1f8._6_1_ == uStack_170._6_1_);
            auVar16[0xf] = -(uStack_1f8._7_1_ == uStack_170._7_1_);
            auVar15[0] = -((char)local_210._vptr_lazy_ostream == (char)local_188);
            auVar15[1] = -(local_210._vptr_lazy_ostream._1_1_ == local_188._1_1_);
            auVar15[2] = -(local_210._vptr_lazy_ostream._2_1_ == local_188._2_1_);
            auVar15[3] = -(local_210._vptr_lazy_ostream._3_1_ == local_188._3_1_);
            auVar15[4] = -(local_210._vptr_lazy_ostream._4_1_ == local_188._4_1_);
            auVar15[5] = -(local_210._vptr_lazy_ostream._5_1_ == local_188._5_1_);
            auVar15[6] = -(local_210._vptr_lazy_ostream._6_1_ == local_188._6_1_);
            auVar15[7] = -(local_210._vptr_lazy_ostream._7_1_ == local_188._7_1_);
            auVar15[8] = -(local_210.m_empty == (bool)(char)uStack_180);
            auVar15[9] = -(local_210._9_1_ == uStack_180._1_1_);
            auVar15[10] = -(local_210._10_1_ == uStack_180._2_1_);
            auVar15[0xb] = -(local_210._11_1_ == uStack_180._3_1_);
            auVar15[0xc] = -(local_210._12_1_ == uStack_180._4_1_);
            auVar15[0xd] = -(local_210._13_1_ == uStack_180._5_1_);
            auVar15[0xe] = -(local_210._14_1_ == uStack_180._6_1_);
            auVar15[0xf] = -(local_210._15_1_ == uStack_180._7_1_);
            auVar15 = auVar15 & auVar16;
            local_368.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)
                    (readonly_property<bool>)
                    ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff);
            local_368.m_message.px = (element_type *)0x0;
            local_368.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_398 = "computed_header_basic == filter_header_basic";
            local_390 = "";
            local_388.m_message.px = (element_type *)(local_388.m_message._1_8_ << 8);
            local_388._0_8_ = &PTR__lazy_ostream_013ae1c8;
            local_388.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_370 = &local_398;
            in_stack_fffffffffffffc58 =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
            ;
            in_stack_fffffffffffffc60 = "";
            in_R8 = (iterator)0x1;
            in_R9 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (&local_368,(lazy_ostream *)&local_388,1,0,WARN,(check_type)this_00,
                       (size_t)&stack0xfffffffffffffc58,0xaf);
            boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
            if (local_1a0 != (pointer)0x0) {
              operator_delete(local_1a0,(long)local_190 - (long)local_1a0);
            }
            if (local_300.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_300.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_300.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_300.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector
                      ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)local_2e8);
            std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)local_d8);
          }
        }
        if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        }
        index_00 = (size_t)((int)index_00 + 1);
        uVar10 = ((long)(this_00->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_00->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      } while (index_00 <= uVar10 && uVar10 - index_00 != 0);
    }
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)(local_58 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0])
                             + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(blockfilters_json_test)
{
    UniValue json;
    if (!json.read(json_tests::blockfilters) || !json.isArray()) {
        BOOST_ERROR("Parse error.");
        return;
    }

    const UniValue& tests = json.get_array();
    for (unsigned int i = 0; i < tests.size(); i++) {
        const UniValue& test = tests[i];
        std::string strTest = test.write();

        if (test.size() == 1) {
            continue;
        } else if (test.size() < 7) {
            BOOST_ERROR("Bad test: " << strTest);
            continue;
        }

        unsigned int pos = 0;
        /*int block_height =*/ test[pos++].getInt<int>();
        BOOST_CHECK(uint256::FromHex(test[pos++].get_str()));

        CBlock block;
        BOOST_REQUIRE(DecodeHexBlk(block, test[pos++].get_str()));

        CBlockUndo block_undo;
        block_undo.vtxundo.emplace_back();
        CTxUndo& tx_undo = block_undo.vtxundo.back();
        const UniValue& prev_scripts = test[pos++].get_array();
        for (unsigned int ii = 0; ii < prev_scripts.size(); ii++) {
            std::vector<unsigned char> raw_script = ParseHex(prev_scripts[ii].get_str());
            CTxOut txout(0, CScript(raw_script.begin(), raw_script.end()));
            tx_undo.vprevout.emplace_back(txout, 0, false);
        }

        uint256 prev_filter_header_basic{*Assert(uint256::FromHex(test[pos++].get_str()))};
        std::vector<unsigned char> filter_basic = ParseHex(test[pos++].get_str());
        uint256 filter_header_basic{*Assert(uint256::FromHex(test[pos++].get_str()))};

        BlockFilter computed_filter_basic(BlockFilterType::BASIC, block, block_undo);
        BOOST_CHECK(computed_filter_basic.GetFilter().GetEncoded() == filter_basic);

        uint256 computed_header_basic = computed_filter_basic.ComputeHeader(prev_filter_header_basic);
        BOOST_CHECK(computed_header_basic == filter_header_basic);
    }
}